

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O2

int nn_sinproc_send(nn_pipebase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  byte *pbVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  nn_fsm *self_01;
  nn_msg nmsg;
  
  self_01 = (nn_fsm *)&self[-1].data;
  if (self == (nn_pipebase *)0x0) {
    self_01 = (nn_fsm *)0x0;
  }
  if (*(int *)&self_01[1].fn != 5) {
    if (*(int *)&self_01[1].fn == 4) {
      if (((ulong)self_01[1].fn & 0x100000000) == 0) {
        sVar2 = nn_chunkref_size(&msg->sphdr);
        self_00 = &msg->body;
        sVar3 = nn_chunkref_size(self_00);
        nn_msg_init(&nmsg,sVar2 + sVar3);
        pvVar4 = nn_chunkref_data(&nmsg.body);
        pvVar5 = nn_chunkref_data(&msg->sphdr);
        sVar2 = nn_chunkref_size(&msg->sphdr);
        memcpy(pvVar4,pvVar5,sVar2);
        pvVar4 = nn_chunkref_data(&nmsg.body);
        sVar2 = nn_chunkref_size(&msg->sphdr);
        pvVar5 = nn_chunkref_data(self_00);
        sVar3 = nn_chunkref_size(self_00);
        memcpy((void *)((long)pvVar4 + sVar2),pvVar5,sVar3);
        nn_msg_term(msg);
        nn_msg_term((nn_msg *)&self_01[4].owner);
        nn_msg_mv((nn_msg *)&self_01[4].owner,&nmsg);
        pbVar1 = (byte *)((long)&self_01[1].fn + 4);
        *pbVar1 = *pbVar1 | 1;
        nn_fsm_raiseto(self_01,(nn_fsm *)self_01[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self_01[1].shutdown_fn)[5].stopped.item,0x6c41,4,
                       self_01);
        return 0;
      }
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!(sinproc->flags & NN_SINPROC_FLAG_SENDING)"
              ,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,0x97);
    }
    else {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)&self_01[1].fn,
              "NN_SINPROC_STATE_ACTIVE",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
              ,0x96);
    }
    fflush(_stderr);
    nn_err_abort();
  }
  return -0x68;
}

Assistant:

static int nn_sinproc_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sinproc *sinproc;
    struct nn_msg nmsg;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  If the peer have already closed the connection, we cannot send
        anymore. */
    if (sinproc->state == NN_SINPROC_STATE_DISCONNECTED)
        return -ECONNRESET;

    /*  Sanity checks. */
    nn_assert_state (sinproc, NN_SINPROC_STATE_ACTIVE);
    nn_assert (!(sinproc->flags & NN_SINPROC_FLAG_SENDING));

    nn_msg_init (&nmsg,
        nn_chunkref_size (&msg->sphdr) +
        nn_chunkref_size (&msg->body));
    memcpy (nn_chunkref_data (&nmsg.body),
        nn_chunkref_data (&msg->sphdr),
        nn_chunkref_size (&msg->sphdr));
    memcpy ((char *)nn_chunkref_data (&nmsg.body) +
        nn_chunkref_size (&msg->sphdr),
        nn_chunkref_data (&msg->body),
        nn_chunkref_size (&msg->body));
    nn_msg_term (msg);

    /*  Expose the message to the peer. */
    nn_msg_term (&sinproc->msg);
    nn_msg_mv (&sinproc->msg, &nmsg);

    /*  Notify the peer that there's a message to get. */
    sinproc->flags |= NN_SINPROC_FLAG_SENDING;
    nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
        &sinproc->peer->event_sent, NN_SINPROC_SRC_PEER,
        NN_SINPROC_SENT, sinproc);

    return 0;
}